

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

void __thiscall JSON::Node::Node(Node *this,string *type,string *rawValue,int start,int end)

{
  pointer pcVar1;
  
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + type->_M_string_length);
  this->start = start;
  this->end = end;
  (this->rawValue)._M_dataplus._M_p = (pointer)&(this->rawValue).field_2;
  pcVar1 = (rawValue->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rawValue,pcVar1,pcVar1 + rawValue->_M_string_length);
  (this->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Node(string type, string rawValue, int start, int end)
                : type(type), rawValue(rawValue), start(start), end(end) {
        }